

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::FindFileByName
          (SourceTreeDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  string *psVar1;
  MultiFileErrorCollector *pMVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  SingleFileErrorCollector file_error_collector;
  Tokenizer tokenizer;
  Parser parser;
  SingleFileErrorCollector SStack_1a8;
  Tokenizer local_170;
  Parser local_b0;
  ZeroCopyInputStream *input;
  
  iVar4 = (*this->source_tree_->_vptr_SourceTree[2])();
  input = (ZeroCopyInputStream *)CONCAT44(extraout_var,iVar4);
  if (input == (ZeroCopyInputStream *)0x0) {
    pMVar2 = this->error_collector_;
    if (pMVar2 != (MultiFileErrorCollector *)0x0) {
      (*this->source_tree_->_vptr_SourceTree[3])(&local_170);
      (*pMVar2->_vptr_MultiFileErrorCollector[2])(pMVar2,filename,0xffffffff,0,&local_170);
      if ((undefined1 **)local_170.current_._0_8_ != (undefined1 **)((long)&local_170 + 0x10U)) {
        operator_delete((void *)local_170.current_._0_8_,
                        local_170.current_.text._M_string_length + 1);
      }
    }
    bVar3 = false;
  }
  else {
    SingleFileErrorCollector::SingleFileErrorCollector(&SStack_1a8,filename,this->error_collector_);
    io::Tokenizer::Tokenizer(&local_170,input,&SStack_1a8.super_ErrorCollector);
    Parser::Parser(&local_b0);
    if (this->error_collector_ != (MultiFileErrorCollector *)0x0) {
      local_b0.error_collector_ = &SStack_1a8.super_ErrorCollector;
    }
    if (this->using_validation_error_collector_ == true) {
      local_b0.source_location_table_ = &this->source_locations_;
    }
    *(byte *)(output->_has_bits_).has_bits_ = (byte)(output->_has_bits_).has_bits_[0] | 1;
    psVar1 = (output->name_).ptr_;
    if (psVar1 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena(&output->name_,filename);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar1);
    }
    bVar3 = Parser::Parse(&local_b0,&local_170,output);
    bVar3 = (bool)(bVar3 & (SStack_1a8.had_errors_ ^ 1U));
    Parser::~Parser(&local_b0);
    io::Tokenizer::~Tokenizer(&local_170);
    SingleFileErrorCollector::~SingleFileErrorCollector(&SStack_1a8);
    (*input->_vptr_ZeroCopyInputStream[1])(input);
  }
  return bVar3;
}

Assistant:

bool SourceTreeDescriptorDatabase::FindFileByName(
    const string& filename, FileDescriptorProto* output) {
  google::protobuf::scoped_ptr<io::ZeroCopyInputStream> input(source_tree_->Open(filename));
  if (input == NULL) {
    if (error_collector_ != NULL) {
      error_collector_->AddError(filename, -1, 0,
                                 source_tree_->GetLastErrorMessage());
    }
    return false;
  }

  // Set up the tokenizer and parser.
  SingleFileErrorCollector file_error_collector(filename, error_collector_);
  io::Tokenizer tokenizer(input.get(), &file_error_collector);

  Parser parser;
  if (error_collector_ != NULL) {
    parser.RecordErrorsTo(&file_error_collector);
  }
  if (using_validation_error_collector_) {
    parser.RecordSourceLocationsTo(&source_locations_);
  }

  // Parse it.
  output->set_name(filename);
  return parser.Parse(&tokenizer, output) &&
         !file_error_collector.had_errors();
}